

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O2

void __thiscall
duckdb::SortedAggregateState::Finalize
          (SortedAggregateState *this,SortedAggregateBindData *order_bind,DataChunk *prefixed,
          LocalSortState *param_3)

{
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *this_00;
  bool bVar1;
  pointer pCVar2;
  pointer pDVar3;
  type pDVar4;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *puVar5;
  ColumnDataScanState sort_state;
  ColumnDataScanState arg_state;
  
  if ((this->arguments).
      super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
      .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl ==
      (ColumnDataCollection *)0x0) {
    if ((this->ordering).
        super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
        .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl ==
        (ColumnDataCollection *)0x0) {
      if ((this->sort_chunk).
          super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
          super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
          super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl == (DataChunk *)0x0) {
        FlushLinkedLists(this,order_bind);
      }
      PrefixSortBuffer(this,prefixed);
      if ((this->arg_chunk).
          super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
          super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
          super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl == (DataChunk *)0x0) {
        puVar5 = &this->sort_chunk;
      }
      else {
        puVar5 = &this->arg_chunk;
      }
      pDVar4 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator*(puVar5);
      LocalSortState::SinkChunk(param_3,prefixed,pDVar4);
    }
    else {
      sort_state.current_chunk_state.handles._M_h._M_buckets =
           &sort_state.current_chunk_state.handles._M_h._M_single_bucket;
      sort_state.current_chunk_state.handles._M_h._M_bucket_count = 1;
      sort_state.current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      sort_state.current_chunk_state.handles._M_h._M_element_count = 0;
      sort_state.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      sort_state.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
      sort_state.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
      sort_state.current_chunk_state.properties = INVALID;
      sort_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      sort_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      sort_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
               ::operator->(&this->ordering);
      ColumnDataCollection::InitializeScan(pCVar2,&sort_state,ALLOW_ZERO_COPY);
      puVar5 = &this->sort_chunk;
      pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator->(puVar5);
      DataChunk::Reset(pDVar3);
      while( true ) {
        pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 ::operator->(&this->ordering);
        pDVar4 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator*(puVar5);
        bVar1 = ColumnDataCollection::Scan(pCVar2,&sort_state,pDVar4);
        if (!bVar1) break;
        PrefixSortBuffer(this,prefixed);
        pDVar4 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator*(puVar5);
        LocalSortState::SinkChunk(param_3,prefixed,pDVar4);
        pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->(puVar5);
        DataChunk::Reset(pDVar3);
      }
      ColumnDataScanState::~ColumnDataScanState(&sort_state);
    }
  }
  else {
    sort_state.current_chunk_state.handles._M_h._M_buckets =
         &sort_state.current_chunk_state.handles._M_h._M_single_bucket;
    sort_state.current_chunk_state.handles._M_h._M_bucket_count = 1;
    sort_state.current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    sort_state.current_chunk_state.handles._M_h._M_element_count = 0;
    sort_state.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    sort_state.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
    sort_state.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
    sort_state.current_chunk_state.properties = INVALID;
    sort_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sort_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sort_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(&this->ordering);
    ColumnDataCollection::InitializeScan(pCVar2,&sort_state,ALLOW_ZERO_COPY);
    arg_state.current_chunk_state.handles._M_h._M_buckets =
         &arg_state.current_chunk_state.handles._M_h._M_single_bucket;
    arg_state.current_chunk_state.handles._M_h._M_bucket_count = 1;
    arg_state.current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    arg_state.current_chunk_state.handles._M_h._M_element_count = 0;
    arg_state.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    arg_state.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
    arg_state.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
    arg_state.current_chunk_state.properties = INVALID;
    arg_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    arg_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    arg_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(&this->arguments);
    ColumnDataCollection::InitializeScan(pCVar2,&arg_state,ALLOW_ZERO_COPY);
    puVar5 = &this->sort_chunk;
    pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       (puVar5);
    DataChunk::Reset(pDVar3);
    this_00 = &this->arg_chunk;
    while( true ) {
      pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
               ::operator->(&this->ordering);
      pDVar4 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator*(puVar5);
      bVar1 = ColumnDataCollection::Scan(pCVar2,&sort_state,pDVar4);
      if (!bVar1) break;
      PrefixSortBuffer(this,prefixed);
      pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator->(this_00);
      DataChunk::Reset(pDVar3);
      pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
               ::operator->(&this->arguments);
      pDVar4 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator*(this_00);
      ColumnDataCollection::Scan(pCVar2,&arg_state,pDVar4);
      pDVar4 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator*(this_00);
      LocalSortState::SinkChunk(param_3,prefixed,pDVar4);
      pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator->(puVar5);
      DataChunk::Reset(pDVar3);
    }
    ColumnDataScanState::~ColumnDataScanState(&arg_state);
    ColumnDataScanState::~ColumnDataScanState(&sort_state);
  }
  Reset(this);
  return;
}

Assistant:

void Finalize(const SortedAggregateBindData &order_bind, DataChunk &prefixed, LocalSortState &local_sort) {
		if (arguments) {
			ColumnDataScanState sort_state;
			ordering->InitializeScan(sort_state);
			ColumnDataScanState arg_state;
			arguments->InitializeScan(arg_state);
			for (sort_chunk->Reset(); ordering->Scan(sort_state, *sort_chunk); sort_chunk->Reset()) {
				PrefixSortBuffer(prefixed);
				arg_chunk->Reset();
				arguments->Scan(arg_state, *arg_chunk);
				local_sort.SinkChunk(prefixed, *arg_chunk);
			}
		} else if (ordering) {
			ColumnDataScanState sort_state;
			ordering->InitializeScan(sort_state);
			for (sort_chunk->Reset(); ordering->Scan(sort_state, *sort_chunk); sort_chunk->Reset()) {
				PrefixSortBuffer(prefixed);
				local_sort.SinkChunk(prefixed, *sort_chunk);
			}
		} else {
			//	Force chunks so we can sort
			if (!sort_chunk) {
				FlushLinkedLists(order_bind);
			}

			PrefixSortBuffer(prefixed);
			if (arg_chunk) {
				local_sort.SinkChunk(prefixed, *arg_chunk);
			} else {
				local_sort.SinkChunk(prefixed, *sort_chunk);
			}
		}

		Reset();
	}